

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testgest.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  ushort uVar2;
  Am_Object *pAVar3;
  Am_Wrapper *pAVar4;
  ostream *poVar5;
  Am_Object window;
  Am_Object gesture1;
  Am_Object gesture1_feedback;
  Am_Gesture_Classifier gc;
  Am_Gesture_Classifier local_50 [8];
  Am_Object local_48 [8];
  Am_Object local_40 [8];
  Am_Object local_38 [8];
  Am_Gesture_Classifier local_30 [8];
  Am_Object local_28 [8];
  Am_Object local_20 [8];
  Am_Object local_18 [8];
  
  Am_Gesture_Classifier::Am_Gesture_Classifier(local_30);
  Am_Initialize();
  if (1 < argc) {
    Am_Gesture_Classifier::Am_Gesture_Classifier(local_50,argv[1]);
    Am_Gesture_Classifier::operator=(local_30,local_50);
    Am_Gesture_Classifier::~Am_Gesture_Classifier(local_50);
    cVar1 = Am_Gesture_Classifier::Valid();
    if (cVar1 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"can\'t open %s\n",0xe);
      poVar5 = std::operator<<((ostream *)&std::cerr,argv[1]);
      std::endl<char,std::char_traits<char>>(poVar5);
      exit(-1);
    }
  }
  Am_Object::Create((char *)local_40);
  uVar2 = Am_Object::Set((ushort)local_40,100,0x14);
  uVar2 = Am_Object::Set(uVar2,0x65,0x32);
  uVar2 = Am_Object::Set(uVar2,0x66,500);
  pAVar3 = (Am_Object *)Am_Object::Set(uVar2,0x67,500);
  Am_Object::Am_Object((Am_Object *)local_50,pAVar3);
  Am_Object::~Am_Object(local_40);
  Am_Object::Am_Object(local_18,(Am_Object *)local_50);
  Am_Object::Add_Part(&Am_Screen,local_18,1,0);
  Am_Object::~Am_Object(local_18);
  Am_Object::Create((char *)local_48);
  pAVar3 = (Am_Object *)Am_Object::Set((ushort)local_48,0x6a,0);
  Am_Object::Am_Object(local_40,pAVar3);
  Am_Object::~Am_Object(local_48);
  Am_Object::Am_Object(local_20,local_40);
  Am_Object::Add_Part(local_50,local_20,1,0);
  Am_Object::~Am_Object(local_20);
  Am_Object::Create((char *)local_38);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(local_40);
  uVar2 = Am_Object::Set((ushort)local_38,(Am_Wrapper *)0xdc,(ulong)pAVar4);
  pAVar4 = Am_Gesture_Classifier::operator_cast_to_Am_Wrapper_(local_30);
  uVar2 = Am_Object::Set(uVar2,(Am_Wrapper *)0x140,(ulong)pAVar4);
  uVar2 = Am_Object::Set(uVar2,0.95,0x143);
  pAVar3 = (Am_Object *)Am_Object::Set(uVar2,0x144,200);
  Am_Object::Am_Object(local_48,pAVar3);
  Am_Object::~Am_Object(local_38);
  Am_Object::Get_Object((ushort)local_38,(ulong)local_48);
  Am_Object::Set((ushort)local_38,(Am_Method_Wrapper *)0xca,(ulong)Gesture1_Do.from_wrapper);
  Am_Object::~Am_Object(local_38);
  Am_Object::Am_Object(local_28,local_48);
  Am_Object::Add_Part(local_50,local_28,1,0);
  Am_Object::~Am_Object(local_28);
  Am_Main_Event_Loop();
  Am_Cleanup();
  Am_Object::~Am_Object(local_48);
  Am_Object::~Am_Object(local_40);
  Am_Object::~Am_Object((Am_Object *)local_50);
  Am_Gesture_Classifier::~Am_Gesture_Classifier(local_30);
  return 0;
}

Assistant:

int
main(int argc, char *argv[])
{
  Am_Gesture_Classifier gc;

  Am_Initialize();

  if (argc > 1) {
    gc = Am_Gesture_Classifier(argv[1]);
    if (!gc.Valid()) {
      cerr << "can't open %s\n" << argv[1] << endl;
      exit(-1);
    }
  }

  Am_Object window = Am_Window.Create("window")
                         .Set(Am_LEFT, 20)
                         .Set(Am_TOP, 50)
                         .Set(Am_WIDTH, 500)
                         .Set(Am_HEIGHT, 500);
  Am_Screen.Add_Part(window);

  Am_Object gesture1_feedback =
      Am_Polygon.Create("gesture1_feedback").Set(Am_FILL_STYLE, (0L));
  window.Add_Part(gesture1_feedback);

  Am_Object gesture1 = Am_Gesture_Interactor.Create("gesture1")
                           .Set(Am_FEEDBACK_OBJECT, gesture1_feedback)
                           .Set(Am_CLASSIFIER, gc)
                           .Set(Am_MIN_NONAMBIGUITY_PROB, 0.95)
                           .Set(Am_MAX_DIST_TO_MEAN, 200);
  gesture1.Get_Object(Am_COMMAND).Set(Am_DO_METHOD, Gesture1_Do);
  window.Add_Part(gesture1);

  Am_Main_Event_Loop();
  Am_Cleanup();

  return 0;
}